

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void __thiscall
duckdb::HistogramBinState<duckdb::string_t>::InitializeBins<duckdb::HistogramStringFunctor>
          (HistogramBinState<duckdb::string_t> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  pointer *ppsVar1;
  size_type __n;
  vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *this_00;
  iterator __position;
  pointer psVar2;
  long lVar3;
  bool bVar4;
  unsafe_vector<duckdb::string_t> *puVar5;
  unsafe_vector<idx_t> *puVar6;
  Vector *this_01;
  idx_t iVar7;
  ulong uVar8;
  BinderException *pBVar9;
  size_type sVar10;
  pointer psVar11;
  pointer __src;
  idx_t offset;
  UnifiedVectorFormat bin_child_data;
  UnifiedVectorFormat bin_data;
  anon_union_16_2_67f50693_for_value local_e0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  SelectionVector local_b0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  UnifiedVectorFormat local_78;
  
  puVar5 = (unsafe_vector<duckdb::string_t> *)operator_new(0x18);
  (puVar5->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (puVar5->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (puVar5->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bin_boundaries = puVar5;
  puVar6 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar6->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar6->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar6->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar6;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(bin_vector,count,&local_78);
  if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
    pos = (idx_t)(local_78.sel)->sel_vector[pos];
  }
  offset = *(idx_t *)(local_78.data + pos * 0x10);
  __n = *(size_type *)(local_78.data + pos * 0x10 + 8);
  if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
       (unsigned_long *)0x0) &&
     ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[pos >> 6] >>
       (pos & 0x3f) & 1) == 0)) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    local_c0._0_8_ = local_b0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"Histogram bin list cannot be NULL","");
    BinderException::BinderException(pBVar9,(string *)local_c0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = ListVector::GetEntry(bin_vector);
  iVar7 = ListVector::GetListSize(bin_vector);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  Vector::ToUnifiedFormat(this_01,iVar7,(UnifiedVectorFormat *)local_c0);
  ::std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::reserve
            (&this->bin_boundaries->
              super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>,__n);
  if (__n != 0) {
    sVar10 = __n;
    do {
      iVar7 = offset;
      if (*(long *)local_c0._0_8_ != 0) {
        iVar7 = (idx_t)*(uint *)(*(long *)local_c0._0_8_ + offset * 4);
      }
      if ((unsigned_long *)local_b0[0].sel_vector != (unsigned_long *)0x0) {
        if ((*(ulong *)((long)local_b0[0].sel_vector + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) == 0
           ) {
          pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
          local_e0._0_8_ = local_d0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"Histogram bin entry cannot be NULL","");
          BinderException::BinderException(pBVar9,(string *)&local_e0.pointer);
          __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      this_00 = &this->bin_boundaries->
                 super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>;
      local_e0.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           HistogramStringFunctorBase::ExtractValue<duckdb::string_t>
                     ((UnifiedVectorFormat *)local_c0,offset,aggr_input);
      __position._M_current =
           (this_00->super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::
        _M_realloc_insert<duckdb::string_t>(this_00,__position,(string_t *)&local_e0.pointer);
      }
      else {
        *(undefined8 *)&(__position._M_current)->value = local_e0._0_8_;
        ((__position._M_current)->value).pointer.ptr = local_e0.pointer.ptr;
        ppsVar1 = &(this_00->super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppsVar1 = *ppsVar1 + 1;
      }
      offset = offset + 1;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
  }
  psVar11 = (this->bin_boundaries->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>
            ).super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  psVar2 = (this->bin_boundaries->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>)
           .super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar11 != psVar2) {
    uVar8 = (long)psVar2 - (long)psVar11 >> 4;
    lVar3 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::string_t*,std::vector<duckdb::string_t,std::allocator<duckdb::string_t>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (psVar11,psVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::string_t*,std::vector<duckdb::string_t,std::allocator<duckdb::string_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (psVar11,psVar2);
  }
  psVar11 = (this->bin_boundaries->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>
            ).super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0x10 < (ulong)((long)(this->bin_boundaries->
                           super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                           super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)psVar11)) {
    uVar8 = 1;
    do {
      bVar4 = string_t::operator==(psVar11 + (uVar8 - 1),psVar11 + uVar8);
      if (bVar4) {
        puVar5 = this->bin_boundaries;
        psVar11 = (puVar5->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                  super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                  super__Vector_impl_data._M_start;
        psVar2 = (puVar5->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                 super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        __src = psVar11 + uVar8 + 1;
        if (__src != psVar2) {
          memmove(psVar11 + uVar8,__src,(long)psVar2 - (long)__src);
        }
        ppsVar1 = &(puVar5->super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                   super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppsVar1 = *ppsVar1 + -1;
        uVar8 = uVar8 - 1;
      }
      uVar8 = uVar8 + 1;
      psVar11 = (this->bin_boundaries->
                super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->bin_boundaries->
                                   super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>
                                   ).
                                   super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar11 >> 4))
    ;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->counts,__n + 1);
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  if (local_b0[0].selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0[0].selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}